

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
srell::
regex_replace<srell::u8regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,srell *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          basic_regex<char,_srell::u8regex_traits<char>_> *e,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt,
          match_flag_type flags)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,srell::u8regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*(char **)this,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(*(char **)this + *(long *)(this + 8)),
             (basic_regex<char,_srell::u8regex_traits<char>_> *)s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e,
             (match_flag_type)fmt);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<charT, ST, SA> regex_replace(
	const std::basic_string<charT, ST, SA> &s,
	const basic_regex<charT, traits> &e,
	const std::basic_string<charT, FST, FSA> &fmt,
	const regex_constants::match_flag_type flags = regex_constants::match_default
)
{
	std::basic_string<charT, ST, SA> result;

	regex_replace(std::back_inserter(result), s.begin(), s.end(), e, fmt, flags);
	return result;
}